

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::TestSuite::Skip(TestSuite *this)

{
  int iVar1;
  TestEventListeners *this_00;
  TestSuite *this_01;
  TestSuite *in_RDI;
  UnitTest *unaff_retaddr;
  int i;
  TestEventListener *repeater;
  TestInfo *in_stack_00000080;
  int iVar2;
  int i_00;
  TestSuite *a_current_test_suite;
  
  if ((in_RDI->should_run_ & 1U) != 0) {
    a_current_test_suite = in_RDI;
    UnitTest::GetInstance();
    UnitTest::set_current_test_suite(unaff_retaddr,a_current_test_suite);
    UnitTest::GetInstance();
    this_00 = UnitTest::listeners((UnitTest *)0x128dad);
    this_01 = (TestSuite *)TestEventListeners::repeater(this_00);
    (*this_01->_vptr_TestSuite[6])(this_01,in_RDI);
    (*this_01->_vptr_TestSuite[7])(this_01,in_RDI);
    iVar2 = 0;
    while (i_00 = iVar2, iVar1 = total_test_count((TestSuite *)0x128df4), iVar2 < iVar1) {
      GetMutableTestInfo(this_01,i_00);
      TestInfo::Skip(in_stack_00000080);
      iVar2 = i_00 + 1;
    }
    (*this_01->_vptr_TestSuite[0xc])(this_01,in_RDI);
    (*this_01->_vptr_TestSuite[0xd])(this_01,in_RDI);
    UnitTest::GetInstance();
    UnitTest::set_current_test_suite(unaff_retaddr,a_current_test_suite);
  }
  return;
}

Assistant:

void TestSuite::Skip() {
  if (!should_run_) return;

  UnitTest::GetInstance()->set_current_test_suite(this);

  TestEventListener* repeater = UnitTest::GetInstance()->listeners().repeater();

  // Call both legacy and the new API
  repeater->OnTestSuiteStart(*this);
//  Legacy API is deprecated but still available
#ifndef GTEST_REMOVE_LEGACY_TEST_CASEAPI_
  repeater->OnTestCaseStart(*this);
#endif  //  GTEST_REMOVE_LEGACY_TEST_CASEAPI_

  for (int i = 0; i < total_test_count(); i++) {
    GetMutableTestInfo(i)->Skip();
  }

  // Call both legacy and the new API
  repeater->OnTestSuiteEnd(*this);
  // Legacy API is deprecated but still available
#ifndef GTEST_REMOVE_LEGACY_TEST_CASEAPI_
  repeater->OnTestCaseEnd(*this);
#endif  //  GTEST_REMOVE_LEGACY_TEST_CASEAPI_

  UnitTest::GetInstance()->set_current_test_suite(nullptr);
}